

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O1

bool __thiscall QToolBarAreaLayout::toolBarBreak(QToolBarAreaLayout *this,QToolBar *toolBar)

{
  undefined8 *puVar1;
  QToolBarAreaLayoutLine *pQVar2;
  ulong uVar3;
  byte in_AL;
  int iVar4;
  undefined4 extraout_var;
  QToolBar *pQVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  bool bVar10;
  
  lVar6 = 0;
  do {
    iVar4 = 5;
    if (this->docks[lVar6].lines.d.size != 0) {
      uVar7 = 0;
      do {
        pQVar2 = this->docks[lVar6].lines.d.ptr;
        iVar4 = 0;
        bVar10 = pQVar2[uVar7].toolBarItems.d.size != 0;
        if (bVar10) {
          iVar4 = (*(pQVar2[uVar7].toolBarItems.d.ptr)->widgetItem->_vptr_QLayoutItem[0xd])();
          if ((QToolBar *)CONCAT44(extraout_var,iVar4) != toolBar) {
            lVar8 = 0x18;
            uVar9 = 0;
            do {
              uVar9 = uVar9 + 1;
              uVar3 = pQVar2[uVar7].toolBarItems.d.size;
              bVar10 = uVar9 < uVar3;
              if (uVar3 <= uVar9) {
                iVar4 = 0;
                goto LAB_004b976c;
              }
              puVar1 = (undefined8 *)((long)&(pQVar2[uVar7].toolBarItems.d.ptr)->widgetItem + lVar8)
              ;
              lVar8 = lVar8 + 0x18;
              pQVar5 = (QToolBar *)(**(code **)(*(long *)*puVar1 + 0x68))();
            } while (pQVar5 != toolBar);
          }
          in_AL = uVar7 != 0 && (QToolBar *)CONCAT44(extraout_var,iVar4) == toolBar;
          iVar4 = 1;
        }
LAB_004b976c:
        if (bVar10) goto LAB_004b979b;
        uVar7 = uVar7 + 1;
      } while (uVar7 < (ulong)this->docks[lVar6].lines.d.size);
      iVar4 = 5;
    }
LAB_004b979b:
    if ((iVar4 != 5) && (iVar4 != 0)) goto LAB_004b97b9;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 4);
  in_AL = 0;
LAB_004b97b9:
  return (bool)(in_AL & 1);
}

Assistant:

bool QToolBarAreaLayout::toolBarBreak(QToolBar *toolBar) const
{
    for (int i = 0; i < QInternal::DockCount; ++i) {
        const QToolBarAreaLayoutInfo &dock = docks[i];

        for (int j = 0; j < dock.lines.size(); ++j) {
            const QToolBarAreaLayoutLine &line = dock.lines.at(j);

            for (int k = 0; k < line.toolBarItems.size(); ++k) {
                if (line.toolBarItems.at(k).widgetItem->widget() == toolBar)
                    return j > 0 && k == 0;
            }
        }
    }

    return false;
}